

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTFlightData.cpp
# Opt level: O0

LTFlightData * __thiscall LTFlightData::operator=(LTFlightData *this,LTFlightData *fd)

{
  long in_RSI;
  LTFlightData *in_RDI;
  system_error *e;
  lock_guard<std::recursive_mutex> lock;
  deque<LTFlightData::FDDynamicData,_std::allocator<LTFlightData::FDDynamicData>_>
  *in_stack_00000168;
  deque<LTFlightData::FDDynamicData,_std::allocator<LTFlightData::FDDynamicData>_>
  *in_stack_00000170;
  FDStaticData *in_stack_ffffffffffffffa8;
  FDStaticData *in_stack_ffffffffffffffb0;
  
  std::lock_guard<std::recursive_mutex>::lock_guard
            ((lock_guard<std::recursive_mutex> *)in_stack_ffffffffffffffb0,
             (mutex_type *)in_stack_ffffffffffffffa8);
  FDKeyTy::operator=((FDKeyTy *)in_stack_ffffffffffffffb0,(FDKeyTy *)in_stack_ffffffffffffffa8);
  in_RDI->rcvr = *(int *)(in_RSI + 0x30);
  in_RDI->sig = *(int *)(in_RSI + 0x34);
  std::__cxx11::string::operator=((string *)&in_RDI->labelStat,(string *)(in_RSI + 0x38));
  in_RDI->labelCfg = *(LabelCfgTy *)(in_RSI + 0x58);
  std::deque<positionTy,_std::allocator<positionTy>_>::operator=
            ((deque<positionTy,_std::allocator<positionTy>_> *)in_stack_00000170,
             (deque<positionTy,_std::allocator<positionTy>_> *)in_stack_00000168);
  std::deque<positionTy,_std::allocator<positionTy>_>::operator=
            ((deque<positionTy,_std::allocator<positionTy>_> *)in_stack_00000170,
             (deque<positionTy,_std::allocator<positionTy>_> *)in_stack_00000168);
  std::deque<LTFlightData::FDDynamicData,_std::allocator<LTFlightData::FDDynamicData>_>::operator=
            (in_stack_00000170,in_stack_00000168);
  in_RDI->rotateTS = *(double *)(in_RSI + 0x150);
  in_RDI->youngestTS = *(double *)(in_RSI + 0x158);
  FDStaticData::operator=(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  in_RDI->pAc = *(LTAircraft **)(in_RSI + 0x360);
  in_RDI->probeRef = *(XPLMProbeRef *)(in_RSI + 0x368);
  in_RDI->bValid = (bool)(*(byte *)(in_RSI + 0x370) & 1);
  std::lock_guard<std::recursive_mutex>::~lock_guard((lock_guard<std::recursive_mutex> *)0x1d163f);
  return in_RDI;
}

Assistant:

LTFlightData& LTFlightData::operator=(const LTFlightData& fd)
{
    try {
        // access guarded by a mutex
        std::lock_guard<std::recursive_mutex> lock (dataAccessMutex);
        // copy data
        acKey               = fd.acKey;             // key
        rcvr                = fd.rcvr;
        sig                 = fd.sig;
        labelStat           = fd.labelStat;
        labelCfg            = fd.labelCfg;
        posDeque            = fd.posDeque;          // dynamic data
        posToAdd            = fd.posToAdd;
        dynDataDeque        = fd.dynDataDeque;
        rotateTS            = fd.rotateTS;
        youngestTS          = fd.youngestTS;
        statData            = fd.statData;          // static data
        pAc                 = fd.pAc;
        probeRef            = fd.probeRef;
        bValid              = fd.bValid;
    } catch(const std::system_error& e) {
        LOG_MSG(logERR, ERR_LOCK_ERROR, key().c_str(), e.what());
    }
    return *this;
}